

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::endpoint_to_bytes_abi_cxx11_(string *__return_storage_ptr__,aux *this,endpoint *ep)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20.container = __return_storage_ptr__;
  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::back_insert_iterator<std::__cxx11::string>&>
            ((basic_endpoint<boost::asio::ip::udp> *)this,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string endpoint_to_bytes(udp::endpoint const& ep)
	{
		std::string ret;
		std::back_insert_iterator<std::string> out(ret);
		aux::write_endpoint(ep, out);
		return ret;
	}